

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O0

MVECTOR<float> * CCEXP::getRow<float>(CCEXP *obj,char *matname,size_t row)

{
  size_t sel_00;
  unsigned_long uVar1;
  char *pcVar2;
  char *local_50;
  char *local_48;
  MVECTOR<float> *vret;
  size_t sel;
  size_t row_local;
  char *matname_local;
  CCEXP *obj_local;
  
  obj->ErrorId = 0;
  sel_00 = CCEXP::getTableIndexByName(obj,matname);
  uVar1 = std::numeric_limits<unsigned_long>::max();
  if (sel_00 == uVar1) {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                       ,0x5c);
      if (pcVar2 == (char *)0x0) {
        local_50 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
        ;
      }
      else {
        local_50 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                           ,0x5c);
        local_50 = local_50 + 1;
      }
      local_48 = local_50;
    }
    else {
      local_48 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/terablade2001[P]CCEXP/C++/test/../src/include/CCEXP.hpp"
                         ,0x2f);
      local_48 = local_48 + 1;
    }
    CECS::RecError((CECS *)CCEXPECS,-9999,1,local_48,0x33d,
                   "[%s]: getRow():: Failed to find table with name [%s]!",obj->SavingFile,matname);
    obj_local = (CCEXP *)0x0;
  }
  else {
    obj_local = (CCEXP *)getRow<float>(obj,sel_00,row);
  }
  return (MVECTOR<float> *)obj_local;
}

Assistant:

inline MVECTOR<T>* getRow(
	CCEXP &obj, const char* matname, size_t row
) {
	obj.ErrorId = 0;
	size_t sel = obj.getTableIndexByName(matname);
	CECS_ERRN(CCEXPECS,sel == MAXSIZE_T,"[%s]: getRow():: Failed to find table with name [%s]!", obj.SavingFile, matname);
	MVECTOR<T>* vret = getRow<T>(obj, sel, row);
	return vret;
}